

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ldst_pair(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int base,int16_t offset)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 addr;
  TCGv_i64 t;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int16_t offset_local;
  int base_local;
  int rd_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (((ctx->hflags & 0x87f800) == 0) && (rd != 0x1f)) {
    addr = tcg_temp_new_i64(tcg_ctx_00);
    t = tcg_temp_new_i64(tcg_ctx_00);
    gen_base_offset_addr(ctx,addr,base,(int)offset);
    switch(opc) {
    case 1:
      if (rd == base) {
        generate_exception_end(ctx,0x14);
        return;
      }
      tcg_gen_qemu_ld_i64_mips64el(tcg_ctx_00,t,addr,(long)ctx->mem_idx,MO_LESL);
      gen_store_gpr(tcg_ctx_00,t,rd);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,t,4);
      gen_op_addr_add(ctx,addr,addr,t);
      tcg_gen_qemu_ld_i64_mips64el(tcg_ctx_00,t,addr,(long)ctx->mem_idx,MO_LESL);
      gen_store_gpr(tcg_ctx_00,t,rd + 1);
      break;
    case 4:
      if (rd == base) {
        generate_exception_end(ctx,0x14);
        return;
      }
      tcg_gen_qemu_ld_i64_mips64el(tcg_ctx_00,t,addr,(long)ctx->mem_idx,MO_64);
      gen_store_gpr(tcg_ctx_00,t,rd);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,t,8);
      gen_op_addr_add(ctx,addr,addr,t);
      tcg_gen_qemu_ld_i64_mips64el(tcg_ctx_00,t,addr,(long)ctx->mem_idx,MO_64);
      gen_store_gpr(tcg_ctx_00,t,rd + 1);
      break;
    case 9:
      gen_load_gpr(tcg_ctx_00,t,rd);
      tcg_gen_qemu_st_i64_mips64el(tcg_ctx_00,t,addr,(long)ctx->mem_idx,MO_32);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,t,4);
      gen_op_addr_add(ctx,addr,addr,t);
      gen_load_gpr(tcg_ctx_00,t,rd + 1);
      tcg_gen_qemu_st_i64_mips64el(tcg_ctx_00,t,addr,(long)ctx->mem_idx,MO_32);
      break;
    case 0xc:
      gen_load_gpr(tcg_ctx_00,t,rd);
      tcg_gen_qemu_st_i64_mips64el(tcg_ctx_00,t,addr,(long)ctx->mem_idx,MO_64);
      tcg_gen_movi_i64_mips64el(tcg_ctx_00,t,8);
      gen_op_addr_add(ctx,addr,addr,t);
      gen_load_gpr(tcg_ctx_00,t,rd + 1);
      tcg_gen_qemu_st_i64_mips64el(tcg_ctx_00,t,addr,(long)ctx->mem_idx,MO_64);
    }
    tcg_temp_free_i64(tcg_ctx_00,addr);
    tcg_temp_free_i64(tcg_ctx_00,t);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void gen_ldst_pair(DisasContext *ctx, uint32_t opc, int rd,
                          int base, int16_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (ctx->hflags & MIPS_HFLAG_BMASK || rd == 31) {
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    gen_base_offset_addr(ctx, t0, base, offset);

    switch (opc) {
    case LWP:
        if (rd == base) {
            generate_exception_end(ctx, EXCP_RI);
            return;
        }
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TESL);
        gen_store_gpr(tcg_ctx, t1, rd);
        tcg_gen_movi_tl(tcg_ctx, t1, 4);
        gen_op_addr_add(ctx, t0, t0, t1);
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TESL);
        gen_store_gpr(tcg_ctx, t1, rd + 1);
        break;
    case SWP:
        gen_load_gpr(tcg_ctx, t1, rd);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        tcg_gen_movi_tl(tcg_ctx, t1, 4);
        gen_op_addr_add(ctx, t0, t0, t1);
        gen_load_gpr(tcg_ctx, t1, rd + 1);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        break;
#ifdef TARGET_MIPS64
    case LDP:
        if (rd == base) {
            generate_exception_end(ctx, EXCP_RI);
            return;
        }
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEQ);
        gen_store_gpr(tcg_ctx, t1, rd);
        tcg_gen_movi_tl(tcg_ctx, t1, 8);
        gen_op_addr_add(ctx, t0, t0, t1);
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEQ);
        gen_store_gpr(tcg_ctx, t1, rd + 1);
        break;
    case SDP:
        gen_load_gpr(tcg_ctx, t1, rd);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEQ);
        tcg_gen_movi_tl(tcg_ctx, t1, 8);
        gen_op_addr_add(ctx, t0, t0, t1);
        gen_load_gpr(tcg_ctx, t1, rd + 1);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEQ);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}